

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O2

int subprocess::util::read_all(FILE *fp,vector<char,_std::allocator<char>_> *buf)

{
  long lVar1;
  int iVar2;
  int iVar3;
  pointer buf_00;
  long lVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  buf_00 = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar4 = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)buf_00;
  iVar3 = 0;
  do {
    iVar2 = read_atmost_n(fp,buf_00,(long)(int)lVar4);
    if (iVar2 == -1) {
      if (iVar3 == 0) {
        iVar3 = -1;
      }
      else {
LAB_0061606b:
        std::vector<char,_std::allocator<char>_>::erase
                  (buf,(const_iterator)
                       ((buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_start + iVar3),
                   (const_iterator)
                   (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return iVar3;
      }
      __stack_chk_fail();
    }
    if (iVar2 != (int)lVar4) {
      iVar3 = iVar3 + iVar2;
      goto LAB_0061606b;
    }
    lVar4 = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    std::vector<char,_std::allocator<char>_>::resize(buf,lVar4 * 2);
    iVar3 = iVar3 + iVar2;
    buf_00 = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_start + iVar3;
  } while( true );
}

Assistant:

static inline int read_all(FILE* fp, std::vector<char>& buf)
  {
    auto buffer = buf.data();
    int total_bytes_read = 0;
    int fill_sz = buf.size();

    while (1) {
      const int rd_bytes = read_atmost_n(fp, buffer, fill_sz);

      if (rd_bytes == -1) { // Read finished
        if (total_bytes_read == 0) return -1;
        break;

      } else if (rd_bytes == fill_sz) { // Buffer full
        const auto orig_sz = buf.size();
        const auto new_sz = orig_sz * 2;
        buf.resize(new_sz);
        fill_sz = new_sz - orig_sz;

        //update the buffer pointer
        buffer = buf.data();
        total_bytes_read += rd_bytes;
        buffer += total_bytes_read;

      } else { // Partial data ? Continue reading
        total_bytes_read += rd_bytes;
        fill_sz -= rd_bytes;
        break;
      }
    }
    buf.erase(buf.begin()+total_bytes_read, buf.end()); // remove extra nulls
    return total_bytes_read;
  }